

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionIDTestCase.cpp
# Opt level: O2

void __thiscall SuiteSessionIDTests::TeststreamIn::RunImpl(TeststreamIn *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails TStack_648;
  TestDetails local_628;
  stringstream strstream3;
  ostream local_5f8;
  stringstream strstream2;
  ostream local_470;
  SessionID object;
  stringstream strstream;
  ostream local_180;
  
  FIX::SessionID::SessionID(&object);
  std::__cxx11::stringstream::stringstream((stringstream *)&strstream);
  std::operator<<(&local_180,"FIX.4.2:SENDER->TARGET");
  FIX::operator>>((istream *)&strstream,&object);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  std::__cxx11::string::string((string *)&strstream2,(string *)&object.m_frozenString);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&strstream3,*ppTVar3,0x76);
  UnitTest::CheckEqual<char[23],std::__cxx11::string>
            (pTVar1,(char (*) [23])"FIX.4.2:SENDER->TARGET",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&strstream2,
             (TestDetails *)&strstream3);
  std::__cxx11::string::~string((string *)&strstream2);
  std::__cxx11::stringstream::stringstream((stringstream *)&strstream2);
  std::operator<<(&local_470,"FIX.4.2:SENDER->TARGET:QUALIFIER");
  FIX::operator>>((istream *)&strstream2,&object);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  std::__cxx11::string::string((string *)&strstream3,(string *)&object.m_frozenString);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&TStack_648,*ppTVar3,0x7b);
  UnitTest::CheckEqual<char[33],std::__cxx11::string>
            (pTVar1,(char (*) [33])"FIX.4.2:SENDER->TARGET:QUALIFIER",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&strstream3,
             &TStack_648);
  std::__cxx11::string::~string((string *)&strstream3);
  std::__cxx11::stringstream::stringstream((stringstream *)&strstream3);
  std::operator<<(&local_5f8,"FIX.4.2:SENDER-ID->TARGET:QUALIFIER");
  FIX::operator>>((istream *)&strstream3,&object);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  std::__cxx11::string::string((string *)&TStack_648,(string *)&object.m_frozenString);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_628,*ppTVar3,0x80);
  UnitTest::CheckEqual<char[36],std::__cxx11::string>
            (pTVar1,(char (*) [36])"FIX.4.2:SENDER-ID->TARGET:QUALIFIER",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_648,
             &local_628);
  std::__cxx11::string::~string((string *)&TStack_648);
  std::__cxx11::stringstream::~stringstream((stringstream *)&strstream3);
  std::__cxx11::stringstream::~stringstream((stringstream *)&strstream2);
  std::__cxx11::stringstream::~stringstream((stringstream *)&strstream);
  FIX::SessionID::~SessionID(&object);
  return;
}

Assistant:

TEST(streamIn)
{
  SessionID object;
  std::stringstream strstream;
  strstream << "FIX.4.2:SENDER->TARGET";
  strstream >> object;
  CHECK_EQUAL( "FIX.4.2:SENDER->TARGET", object.toString() );

  std::stringstream strstream2;
  strstream2 << "FIX.4.2:SENDER->TARGET:QUALIFIER";
  strstream2 >> object;
  CHECK_EQUAL( "FIX.4.2:SENDER->TARGET:QUALIFIER", object.toString() );

  std::stringstream strstream3;
  strstream3 << "FIX.4.2:SENDER-ID->TARGET:QUALIFIER";
  strstream3 >> object;
  CHECK_EQUAL( "FIX.4.2:SENDER-ID->TARGET:QUALIFIER", object.toString() );
}